

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngmem.c
# Opt level: O0

void png_destroy_png_struct(png_structrp png_ptr)

{
  undefined1 local_500 [8];
  png_struct dummy_struct;
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    dummy_struct._1256_8_ = png_ptr;
    memcpy(local_500,png_ptr,0x4f0);
    memset((void *)dummy_struct._1256_8_,0,0x4f0);
    png_free((png_const_structrp)local_500,(png_voidp)dummy_struct._1256_8_);
    png_free_jmpbuf((png_structrp)local_500);
  }
  return;
}

Assistant:

void /* PRIVATE */
png_destroy_png_struct(png_structrp png_ptr)
{
   if (png_ptr != NULL)
   {
      /* png_free might call png_error and may certainly call
       * png_get_mem_ptr, so fake a temporary png_struct to support this.
       */
      png_struct dummy_struct = *png_ptr;
      memset(png_ptr, 0, (sizeof *png_ptr));
      png_free(&dummy_struct, png_ptr);

#     ifdef PNG_SETJMP_SUPPORTED
         /* We may have a jmp_buf left to deallocate. */
         png_free_jmpbuf(&dummy_struct);
#     endif
   }
}